

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_20.h
# Opt level: O1

void __thiscall chrono::fea::ChElementHexaCorot_20::GetSubBlockOffset(ChElementHexaCorot_20 *this)

{
  return;
}

Assistant:

virtual unsigned int GetSubBlockOffset(int nblock) override { return nodes[nblock]->NodeGetOffset_w(); }